

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_791d::VECTOR_FLATTEN_DIM_2_Test::~VECTOR_FLATTEN_DIM_2_Test
          (VECTOR_FLATTEN_DIM_2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(VECTOR_FLATTEN, DIM_2) {
        vector_dim<int, 2>::type v = {{1,2,3}, {4,5}};
        vector<int> res = vec_flater<int, 2>::flatten(v);
        EXPECT_EQ(res.size(), 5);
        EXPECT_EQ(res[0], 1);
        EXPECT_EQ(res[1], 2);
        EXPECT_EQ(res[3], 4);
        EXPECT_EQ(res[4], 5);
    }